

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pig.cpp
# Opt level: O3

bool __thiscall Pig::getUntilWS(Pig *this,string *result)

{
  ulong uVar1;
  bool bVar2;
  uint c;
  string *input;
  ulong uVar3;
  long *local_48 [2];
  long local_38 [2];
  
  input = (this->_text).
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr;
  uVar1 = this->_cursor;
  uVar3 = uVar1;
  while( true ) {
    c = utf8_next_char(input,&this->_cursor);
    if (c == 0) {
      return uVar1 < this->_cursor;
    }
    bVar2 = unicodeWhitespace(c);
    if (bVar2) break;
    input = (this->_text).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
    uVar3 = this->_cursor;
    if ((input->_M_dataplus)._M_p[uVar3] == '\0') {
LAB_00170bc2:
      std::__cxx11::string::substr((ulong)local_48,(ulong)input);
      std::__cxx11::string::operator=((string *)result,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
      return true;
    }
  }
  this->_cursor = uVar3;
  input = (this->_text).
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr;
  goto LAB_00170bc2;
}

Assistant:

bool Pig::getUntilWS (std::string& result)
{
  auto save = _cursor;

  int c;
  auto prev = _cursor;
  while ((c = utf8_next_char (*_text, _cursor)))
  {
    if (unicodeWhitespace (c))
    {
      _cursor = prev;
      result = _text->substr (save, _cursor - save);
      return true;
    }

    // Note: This test must follow the above unicodeWhitespace(c) test because
    //       it is testing the value of 'c', and eos() is testing _cursor,
    //       which has already been advanced.
    else if (eos ())
    {
      result = _text->substr (save, _cursor - save);
      return true;
    }

    prev = _cursor;
  }

  return _cursor > save;
}